

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm.cpp
# Opt level: O3

int __thiscall ncnn::BatchNorm::forward_inplace(BatchNorm *this,Mat *bottom_top_blob)

{
  float fVar1;
  float fVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  uint uVar8;
  void *pvVar9;
  long lVar10;
  ulong uVar11;
  
  iVar3 = bottom_top_blob->dims;
  if (iVar3 == 3) {
    iVar3 = this->channels;
    if (0 < (long)iVar3) {
      uVar8 = bottom_top_blob->h * bottom_top_blob->w;
      pvVar9 = bottom_top_blob->data;
      sVar6 = bottom_top_blob->cstep;
      pvVar4 = (this->a_data).data;
      pvVar5 = (this->b_data).data;
      sVar7 = bottom_top_blob->elemsize;
      lVar10 = 0;
      do {
        if (0 < (int)uVar8) {
          fVar1 = *(float *)((long)pvVar4 + lVar10 * 4);
          fVar2 = *(float *)((long)pvVar5 + lVar10 * 4);
          uVar11 = 0;
          do {
            *(float *)((long)pvVar9 + uVar11 * 4) =
                 *(float *)((long)pvVar9 + uVar11 * 4) * fVar2 + fVar1;
            uVar11 = uVar11 + 1;
          } while (uVar8 != uVar11);
        }
        lVar10 = lVar10 + 1;
        pvVar9 = (void *)((long)pvVar9 + sVar6 * sVar7);
      } while (lVar10 != iVar3);
    }
  }
  else if (iVar3 == 2) {
    iVar3 = bottom_top_blob->h;
    if (0 < (long)iVar3) {
      uVar8 = bottom_top_blob->w;
      pvVar9 = bottom_top_blob->data;
      pvVar4 = (this->a_data).data;
      pvVar5 = (this->b_data).data;
      lVar10 = 0;
      do {
        if (0 < (int)uVar8) {
          fVar1 = *(float *)((long)pvVar4 + lVar10 * 4);
          fVar2 = *(float *)((long)pvVar5 + lVar10 * 4);
          uVar11 = 0;
          do {
            *(float *)((long)pvVar9 + uVar11 * 4) =
                 *(float *)((long)pvVar9 + uVar11 * 4) * fVar2 + fVar1;
            uVar11 = uVar11 + 1;
          } while (uVar8 != uVar11);
        }
        lVar10 = lVar10 + 1;
        pvVar9 = (void *)((long)pvVar9 + (long)(int)uVar8 * 4);
      } while (lVar10 != iVar3);
    }
  }
  else if ((iVar3 == 1) && (iVar3 = bottom_top_blob->w, 0 < (long)iVar3)) {
    pvVar9 = bottom_top_blob->data;
    pvVar4 = (this->a_data).data;
    pvVar5 = (this->b_data).data;
    lVar10 = 0;
    do {
      *(float *)((long)pvVar9 + lVar10 * 4) =
           *(float *)((long)pvVar9 + lVar10 * 4) * *(float *)((long)pvVar5 + lVar10 * 4) +
           *(float *)((long)pvVar4 + lVar10 * 4);
      lVar10 = lVar10 + 1;
    } while (iVar3 != lVar10);
  }
  return 0;
}

Assistant:

int BatchNorm::forward_inplace(Mat& bottom_top_blob) const
{
    // a = bias - slope * mean / sqrt(var)
    // b = slope / sqrt(var)
    // value = b * value + a

    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        #pragma omp parallel for
        for (int i=0; i<w; i++)
        {
            ptr[i] = b_data[i] * ptr[i] + a_data[i];
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        #pragma omp parallel for
        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

            for (int j=0; j<w; j++)
            {
                ptr[j] = b * ptr[j] + a;
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int size = w * h;

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

            for (int i=0; i<size; i++)
            {
                ptr[i] = b * ptr[i] + a;
            }
        }
    }

    return 0;
}